

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMAddressingModes.h
# Opt level: O0

char * ARM_AM_getShiftOpcStr(ARM_AM_ShiftOpc Op)

{
  char *pcStack_10;
  ARM_AM_ShiftOpc Op_local;
  
  switch(Op) {
  case ARM_AM_asr:
    pcStack_10 = "asr";
    break;
  case ARM_AM_lsl:
    pcStack_10 = "lsl";
    break;
  case ARM_AM_lsr:
    pcStack_10 = "lsr";
    break;
  case ARM_AM_ror:
    pcStack_10 = "ror";
    break;
  case ARM_AM_rrx:
    pcStack_10 = "rrx";
    break;
  default:
    pcStack_10 = anon_var_dwarf_87645 + 0x11;
  }
  return pcStack_10;
}

Assistant:

static inline char *ARM_AM_getShiftOpcStr(ARM_AM_ShiftOpc Op)
{
	switch (Op) {
		default: return "";	//llvm_unreachable("Unknown shift opc!");
		case ARM_AM_asr: return "asr";
		case ARM_AM_lsl: return "lsl";
		case ARM_AM_lsr: return "lsr";
		case ARM_AM_ror: return "ror";
		case ARM_AM_rrx: return "rrx";
	}
}